

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall
ConfidentialTxIn_ConstractorEmpty_Test::TestBody(ConfidentialTxIn_ConstractorEmpty_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  ConfidentialTxIn txin1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  AssertHelper local_180;
  internal local_178 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  ConfidentialTxIn local_168;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_168);
  local_188.ptr_._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_168.super_AbstractTxIn);
  local_180.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_178,"txin1.GetVout()","0",(uint *)&local_188,(int *)&local_180);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_188.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_188.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_188.ptr_ + 8))();
      }
      local_188.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar2 = cfd::core::AbstractTxIn::GetSequence(&local_168.super_AbstractTxIn);
  local_188.ptr_._0_4_ = uVar2;
  local_180.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_178,"txin1.GetSequence()","0",(uint *)&local_188,(int *)&local_180);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_188.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_188.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_188.ptr_ + 8))();
      }
      local_188.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_168);
  return;
}

Assistant:

TEST(ConfidentialTxIn, ConstractorEmpty) {
  ConfidentialTxIn txin1;
  EXPECT_EQ(txin1.GetVout(), 0);
  EXPECT_EQ(txin1.GetSequence(), 0);
}